

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcoderaw.cc
# Opt level: O2

void __thiscall VarnodeData::restoreXml(VarnodeData *this,Element *el,AddrSpaceManager *manage)

{
  long lVar1;
  Translate *pTVar2;
  uintb uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  AddrSpace *pAVar7;
  undefined4 extraout_var_00;
  LowlevelError *this_00;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 *puVar6;
  
  this->space = (AddrSpace *)0x0;
  this->size = 0;
  uVar8 = (ulong)((long)(el->attr).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(el->attr).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar9 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  uVar8 = 0;
  lVar10 = 0;
  while( true ) {
    lVar1 = lVar10 + -0x20;
    if (uVar9 * 0x20 + 0x20 + lVar1 == 0) {
      return;
    }
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((el->attr).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + uVar8),"space");
    if (bVar4) break;
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((el->attr).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + uVar8),"name");
    uVar8 = uVar8 + 0x20;
    lVar10 = lVar1;
    if (bVar4) {
      pTVar2 = manage->defaultspace->trans;
      iVar5 = (*(pTVar2->super_AddrSpaceManager)._vptr_AddrSpaceManager[7])
                        (pTVar2,(long)(el->value).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (-0x20 - lVar1));
      puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar5);
      uVar3 = puVar6[1];
      this->space = (AddrSpace *)*puVar6;
      this->offset = uVar3;
      *(undefined8 *)&this->size = puVar6[2];
      return;
    }
  }
  pAVar7 = AddrSpaceManager::getSpaceByName
                     (manage,(string *)
                             ((long)(el->value).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - lVar10));
  this->space = pAVar7;
  if (pAVar7 != (AddrSpace *)0x0) {
    iVar5 = (*pAVar7->_vptr_AddrSpace[9])(pAVar7,el,&this->size);
    this->offset = CONCAT44(extraout_var_00,iVar5);
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+(&local_50,"Unknown space name: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)(el->value).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - lVar10));
  LowlevelError::LowlevelError(this_00,&local_50);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void VarnodeData::restoreXml(const Element *el,const AddrSpaceManager *manage)

{
  space = (AddrSpace *)0;
  size = 0;
  int4 num = el->getNumAttributes();
  for(int4 i=0;i<num;++i) {
    if (el->getAttributeName(i)=="space") {
      space = manage->getSpaceByName(el->getAttributeValue(i));
      if (space == (AddrSpace *)0)
	throw LowlevelError("Unknown space name: "+el->getAttributeValue(i));
      offset = space->restoreXmlAttributes(el,size);
      return;
    }
    else if (el->getAttributeName(i)=="name") {
      const Translate *trans = manage->getDefaultSpace()->getTrans();
      const VarnodeData &point(trans->getRegister(el->getAttributeValue(i)));
      *this = point;
      return;
    }
  }
}